

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

Curl_addrinfo * Curl_doh(Curl_easy *data,char *hostname,int port,int *waitp)

{
  connectdata *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  dohdata *pdVar4;
  curl_slist *pcVar5;
  connectdata *conn;
  dohdata *dohp;
  int slot;
  CURLcode result;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  *waitp = 1;
  pdVar4 = (dohdata *)(*Curl_ccalloc)(0x488,1);
  (data->req).doh = pdVar4;
  if (pdVar4 == (dohdata *)0x0) {
    return (Curl_addrinfo *)0x0;
  }
  *(uint *)&(pcVar1->bits).field_0x4 = *(uint *)&(pcVar1->bits).field_0x4 & 0xf7ffffff | 0x8000000;
  pdVar4->host = hostname;
  pdVar4->port = port;
  pcVar5 = curl_slist_append((curl_slist *)0x0,"Content-Type: application/dns-message");
  pdVar4->headers = pcVar5;
  if ((pdVar4->headers != (curl_slist *)0x0) &&
     (CVar3 = dohprobe(data,pdVar4->probe,DNS_TYPE_A,hostname,(data->set).str[0x43],data->multi,
                       pdVar4->headers), CVar3 == CURLE_OK)) {
    pdVar4->pending = pdVar4->pending + 1;
    if (pcVar1->ip_version == '\x01') {
      return (Curl_addrinfo *)0x0;
    }
    _Var2 = Curl_ipv6works(data);
    if (!_Var2) {
      return (Curl_addrinfo *)0x0;
    }
    CVar3 = dohprobe(data,pdVar4->probe + 1,DNS_TYPE_AAAA,hostname,(data->set).str[0x43],data->multi
                     ,pdVar4->headers);
    if (CVar3 == CURLE_OK) {
      pdVar4->pending = pdVar4->pending + 1;
      return (Curl_addrinfo *)0x0;
    }
  }
  curl_slist_free_all(pdVar4->headers);
  ((data->req).doh)->headers = (curl_slist *)0x0;
  for (dohp._0_4_ = 0; (int)dohp < 2; dohp._0_4_ = (int)dohp + 1) {
    Curl_close(&pdVar4->probe[(int)dohp].easy);
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_doh(struct Curl_easy *data,
                               const char *hostname,
                               int port,
                               int *waitp)
{
  CURLcode result = CURLE_OK;
  int slot;
  struct dohdata *dohp;
  struct connectdata *conn = data->conn;
  *waitp = TRUE; /* this never returns synchronously */
  (void)hostname;
  (void)port;

  DEBUGASSERT(!data->req.doh);
  DEBUGASSERT(conn);

  /* start clean, consider allocating this struct on demand */
  dohp = data->req.doh = calloc(sizeof(struct dohdata), 1);
  if(!dohp)
    return NULL;

  conn->bits.doh = TRUE;
  dohp->host = hostname;
  dohp->port = port;
  dohp->headers =
    curl_slist_append(NULL,
                      "Content-Type: application/dns-message");
  if(!dohp->headers)
    goto error;

  /* create IPv4 DoH request */
  result = dohprobe(data, &dohp->probe[DOH_PROBE_SLOT_IPADDR_V4],
                    DNS_TYPE_A, hostname, data->set.str[STRING_DOH],
                    data->multi, dohp->headers);
  if(result)
    goto error;
  dohp->pending++;

  if((conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data)) {
    /* create IPv6 DoH request */
    result = dohprobe(data, &dohp->probe[DOH_PROBE_SLOT_IPADDR_V6],
                      DNS_TYPE_AAAA, hostname, data->set.str[STRING_DOH],
                      data->multi, dohp->headers);
    if(result)
      goto error;
    dohp->pending++;
  }
  return NULL;

  error:
  curl_slist_free_all(dohp->headers);
  data->req.doh->headers = NULL;
  for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
    Curl_close(&dohp->probe[slot].easy);
  }
  Curl_safefree(data->req.doh);
  return NULL;
}